

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O2

bool __thiscall
udpdiscovery::Packet::Serialize
          (Packet *this,ProtocolVersion protocol_version,SerializeDirection direction,
          BufferView *buffer_view)

{
  char c;
  bool bVar1;
  uint uVar2;
  char c_00;
  char c_01;
  char c_02;
  int iVar3;
  uint16_t user_data_size;
  uint16_t padding_size;
  uint8_t reserved;
  Packet *local_38;
  
  if (direction == kSerialize) {
    if (protocol_version == kProtocolVersion0) {
      c_00 = 'U';
      c_01 = '6';
      c_02 = 'N';
      c = 'R';
    }
    else {
      if (protocol_version != kProtocolVersion1) {
        return false;
      }
      c_00 = 'V';
      c_01 = '7';
      c_02 = 'O';
      c = 'S';
    }
    local_38 = this;
    impl::BufferView::push_back(buffer_view,c);
    impl::BufferView::push_back(buffer_view,c_02);
    impl::BufferView::push_back(buffer_view,c_01);
    impl::BufferView::push_back(buffer_view,c_00);
    impl::BufferView::push_back(buffer_view,(char)protocol_version);
    this = local_38;
  }
  reserved = '\0';
  iVar3 = 4;
  while (iVar3 = iVar3 + -1, iVar3 != 0) {
    bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>(direction,&reserved,buffer_view);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_char>
                    (direction,&this->packet_type_,buffer_view);
  if (!bVar1) {
    return false;
  }
  if ((direction == kParse) && (1 < this->packet_type_)) {
    return false;
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                    (direction,&this->application_id_,buffer_view);
  if (!bVar1) {
    return false;
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
                    (direction,&this->peer_id_,buffer_view);
  if (!bVar1) {
    return false;
  }
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_long>
                    (direction,&this->snapshot_index_,buffer_view);
  if (!bVar1) {
    return false;
  }
  user_data_size = (uint16_t)(this->user_data_)._M_string_length;
  bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>
                    (direction,&user_data_size,buffer_view);
  if (!bVar1) {
    return false;
  }
  if (direction == kParse) {
    if (protocol_version == kProtocolVersion0) {
      if (0x8000 < user_data_size) {
        return false;
      }
      goto LAB_0010244c;
    }
    uVar2 = 0;
    if (protocol_version == kProtocolVersion1 && 0x1000 < user_data_size) {
      return false;
    }
    padding_size = 0;
  }
  else {
    padding_size = 0;
    if (protocol_version != kProtocolVersion0) goto LAB_00102490;
LAB_0010244c:
    padding_size = 0;
    bVar1 = impl::SerializeUnsignedIntegerBigEndian<unsigned_short>
                      (direction,&padding_size,buffer_view);
    if (0x8000 < padding_size || !bVar1) {
      return false;
    }
    if (direction != kParse) goto LAB_00102490;
    uVar2 = (uint)padding_size;
  }
  if ((int)buffer_view->buffer_->_M_string_length - buffer_view->parsed_ != user_data_size + uVar2)
  {
    return false;
  }
LAB_00102490:
  bVar1 = impl::SerializeString(direction,&this->user_data_,(uint)user_data_size,buffer_view);
  return bVar1;
}

Assistant:

bool Packet::Serialize(ProtocolVersion protocol_version,
                       impl::SerializeDirection direction,
                       impl::BufferView* buffer_view) {
  if (direction == impl::kSerialize) {
    if (protocol_version == kProtocolVersion0) {
      buffer_view->push_back('R');
      buffer_view->push_back('N');
      buffer_view->push_back('6');
      buffer_view->push_back('U');
    } else if (protocol_version == kProtocolVersion1) {
      buffer_view->push_back('S');
      buffer_view->push_back('O');
      buffer_view->push_back('7');
      buffer_view->push_back('V');
    } else {
      return false;
    }

    uint8_t version = protocol_version;
    impl::SerializeUnsignedIntegerBigEndian(impl::kSerialize, &version,
                                            buffer_view);
  }

  uint8_t reserved = 0;
  for (int i = 0; i < 3; ++i) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &reserved,
                                                 buffer_view)) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &packet_type_,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (impl::GetPacketType(packet_type_) == kPacketTypeUnknown) {
      return false;
    }
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &application_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &peer_id_,
                                               buffer_view)) {
    return false;
  }

  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &snapshot_index_,
                                               buffer_view)) {
    return false;
  }

  uint16_t user_data_size = (uint16_t)user_data_.size();
  if (!impl::SerializeUnsignedIntegerBigEndian(direction, &user_data_size,
                                               buffer_view)) {
    return false;
  }

  if (direction == impl::kParse) {
    if (protocol_version == kProtocolVersion0) {
      if (user_data_size > kMaxUserDataSizeV0) {
        return false;
      }
    } else if (protocol_version == kProtocolVersion1) {
      if (user_data_size > kMaxUserDataSizeV1) {
        return false;
      }
    }
  }

  uint16_t padding_size = 0;
  if (protocol_version == kProtocolVersion0) {
    if (!impl::SerializeUnsignedIntegerBigEndian(direction, &padding_size,
                                                 buffer_view)) {
      return false;
    }

    if (padding_size > kMaxPaddingSizeV0) {
      return false;
    }
  }

  // End of serializing header.

  if (direction == impl::kParse) {
    if (buffer_view->LeftUnparsed() != user_data_size + padding_size) {
      return false;
    }
  }

  if (!impl::SerializeString(direction, &user_data_, user_data_size,
                             buffer_view)) {
    return false;
  }

  // Do not serialize padding even for protocol version 0.

  return true;
}